

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ant.cpp
# Opt level: O0

void __thiscall imrt::Ant::generateReference(Ant *this)

{
  pair<int,_int> p;
  int iVar1;
  Station *this_00;
  long in_RDI;
  key_type_conflict *__k;
  int i;
  vector<int,_std::allocator<int>_> vaux;
  int a;
  vector<int,_std::allocator<int>_> iaux;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  aux;
  int s;
  Station *st;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  Collimator *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 local_94;
  undefined4 local_70;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x44); local_14 = local_14 + 1) {
    std::
    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           *)0x142de9);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x142df6);
    this_00 = Plan::get_station((Plan *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    for (local_70 = 0; local_70 < *(int *)(in_RDI + 0x40); local_70 = local_70 + 1) {
      __k = (key_type_conflict *)
            Station::getApertureIntensity
                      ((Station *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      Collimator::getIntensityLevel
                (in_stack_ffffffffffffff10,
                 (double)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x142eaa);
      local_94 = 0;
      while( true ) {
        iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0x38));
        if (iVar1 <= local_94) break;
        in_stack_ffffffffffffff20 = (int)*(undefined8 *)(in_RDI + 0x38);
        in_stack_ffffffffffffff24 = (undefined4)((ulong)*(undefined8 *)(in_RDI + 0x38) >> 0x20);
        Station::getApertureShape
                  ((Station *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0,
                   0x142f04);
        p.second = in_stack_ffffffffffffff20;
        p.first = in_stack_ffffffffffffff1c;
        in_stack_ffffffffffffff1c = Collimator::searchReferenceIndex(in_stack_ffffffffffffff10,p);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10,
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        local_94 = local_94 + 1;
      }
      in_stack_ffffffffffffff10 =
           (Collimator *)
           std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)this_00,__k);
      std::vector<int,_std::allocator<int>_>::operator=
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                (value_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::
    vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
    ::push_back((vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                (value_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    std::
    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            *)0x143028);
  }
  return;
}

Assistant:

void Ant::generateReference() {
    Station * st;
    for (int s=0; s<n_stations; s++) {
      map <int, vector<int>> aux;
      vector <int> iaux;
      st = p->get_station(s);
      for (int a=0; a<n_apertures; a++) {
        // Set reference to intensity
        iaux.push_back(collimator.getIntensityLevel(st->getApertureIntensity(a)));
        
        // Set reference to aperture pattern
        vector <int> vaux;
        for (int i=0; i<collimator.getXdim(); i++) {
          vaux.push_back(collimator.searchReferenceIndex(st->getApertureShape(a,i)));
        }
        aux[a]=vaux;
      }
      ref_intensity.push_back(iaux);
      ref_plan.push_back(aux);
    }
    //printReferencePlan();
  }